

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O2

edata_t * duckdb_je_ecache_alloc_grow
                    (tsdn_t *tsdn,pac_t *pac,ehooks_t *ehooks,ecache_t *ecache,edata_t *expand_edata
                    ,size_t size,size_t alignment,_Bool zero,_Bool guarded)

{
  atomic_zu_t *paVar1;
  size_t sVar2;
  edata_t *edata_00;
  undefined8 uVar3;
  undefined8 expand_edata_00;
  _Bool _Var4;
  extent_split_interior_result_t eVar5;
  edata_t *peVar6;
  uint uVar7;
  void *pvVar8;
  ecache_t *ecache_00;
  ecache_t *peVar9;
  ulong uVar10;
  edata_cache_t *edata_cache;
  undefined1 growing_retained;
  edata_t **trail_00;
  ehooks_t *ehooks_00;
  int iVar11;
  uint uVar12;
  undefined5 uStack_98;
  _Bool commit;
  _Bool committed;
  _Bool zeroed;
  ehooks_t *local_90;
  pac_t *local_88;
  ecache_t *local_80;
  edata_t *local_78;
  ulong local_70;
  edata_t *edata;
  undefined8 local_60;
  undefined8 local_58;
  edata_t *local_50;
  edata_t *to_leak;
  edata_t *trail;
  edata_t *lead;
  
  commit = true;
  malloc_mutex_lock(tsdn,&pac->grow_mtx);
  peVar9 = &pac->ecache_retained;
  uVar10 = (ulong)zero;
  local_90 = ehooks;
  local_60 = expand_edata;
  local_58 = size;
  peVar6 = extent_recycle(tsdn,pac,ehooks,peVar9,expand_edata,size,alignment,zero,&commit,true,
                          guarded);
  expand_edata_00 = local_58;
  uVar3 = local_60;
  ehooks_00 = local_90;
  if (peVar6 == (edata_t *)0x0) {
    local_88 = pac;
    local_80 = peVar9;
    local_70 = uVar10;
    if ((local_60 == 0 && !guarded) && duckdb_je_opt_retain == true) {
      if ((ulong)local_58 <=
          (edata_t *)(local_58 + ((alignment + 0xfff & 0xfffffffffffff000) - 0x1000))) {
        uVar7 = (pac->exp_grow).next;
        iVar11 = 1;
        do {
          peVar6 = (edata_t *)duckdb_je_sz_pind2sz_tab[uVar7];
          if ((edata_t *)(local_58 + ((alignment + 0xfff & 0xfffffffffffff000) - 0x1000)) <= peVar6)
          {
            local_78 = duckdb_je_edata_cache_get(tsdn,pac->edata_cache);
            edata = local_78;
            if (local_78 == (edata_t *)0x0) break;
            zeroed = false;
            committed = false;
            pvVar8 = ehooks_alloc(tsdn,local_90,(void *)0x0,(size_t)peVar6,0x1000,&zeroed,&committed
                                 );
            edata_00 = local_78;
            if (pvVar8 == (void *)0x0) {
              edata_cache = pac->edata_cache;
            }
            else {
              uVar7 = (pac->ecache_retained).ind;
              LOCK();
              paVar1 = &pac->duckdb_je_extent_sn_next;
              sVar2 = paVar1->repr;
              paVar1->repr = paVar1->repr + 1;
              UNLOCK();
              local_78->e_addr = pvVar8;
              (local_78->field_2).e_size_esn =
                   (ulong)((uint)(local_78->field_2).e_size_esn & 0xfff) | (ulong)peVar6;
              local_78->e_sn = sVar2;
              uVar7 = uVar7 & 0xf0000fff;
              local_78->e_bits =
                   (ulong)committed << 0xd | (ulong)zeroed << 0xf | (ulong)uVar7 |
                   local_78->e_bits & 0xffffeffff0000000 | 0x10000e800000;
              _Var4 = extent_register_impl(tsdn,pac,local_78,SUB41(uVar7,0));
              if (!_Var4) {
                if ((edata_00->e_bits & 0x2000) != 0) {
                  commit = true;
                }
                to_leak = (edata_t *)0x0;
                local_50 = (edata_t *)0x0;
                peVar9 = (ecache_t *)&edata;
                trail_00 = &trail;
                eVar5 = extent_split_interior
                                  (tsdn,pac,local_90,(edata_t **)peVar9,&lead,trail_00,&to_leak,
                                   &local_50,(edata_t *)expand_edata_00,alignment,
                                   CONCAT17(zeroed,CONCAT16(committed,CONCAT15(commit,uStack_98))));
                ecache_00 = local_80;
                growing_retained = SUB81(trail_00,0);
                if (eVar5 != extent_split_interior_ok) {
                  if (local_50 != (edata_t *)0x0) {
                    duckdb_je_extent_record(tsdn,pac,local_90,local_80,local_50);
                  }
                  peVar6 = to_leak;
                  if (to_leak != (edata_t *)0x0) {
                    extent_deregister_no_gdump_sub(tsdn,pac,to_leak);
                    extents_abandon_vm(tsdn,pac,local_90,local_80,peVar6,(_Bool)growing_retained);
                  }
                  break;
                }
                if (lead != (edata_t *)0x0) {
                  peVar9 = local_80;
                  duckdb_je_extent_record(tsdn,pac,local_90,local_80,lead);
                }
                if (trail != (edata_t *)0x0) {
                  duckdb_je_extent_record(tsdn,pac,local_90,ecache_00,trail);
                  peVar9 = ecache_00;
                }
                peVar6 = edata;
                if ((commit == true) && ((edata->e_bits & 0x2000) == 0)) {
                  peVar9 = (ecache_t *)0x0;
                  _Var4 = extent_commit_impl(tsdn,local_90,edata,0,
                                             (edata->field_2).e_size_esn & 0xfffffffffffff000,
                                             (_Bool)growing_retained);
                  if (_Var4) {
                    duckdb_je_extent_record(tsdn,pac,local_90,local_80,peVar6);
                    break;
                  }
                }
                uVar12 = iVar11 + (pac->exp_grow).next;
                uVar7 = (pac->exp_grow).limit;
                if (uVar7 <= uVar12) {
                  uVar12 = uVar7;
                }
                (pac->exp_grow).next = uVar12;
                (pac->grow_mtx).field_0.field_0.locked.repr = false;
                pthread_mutex_unlock((pthread_mutex_t *)((long)&(pac->grow_mtx).field_0 + 0x48));
                if (zero) {
                  if ((peVar6->e_bits & 0x8000) != 0) {
                    return peVar6;
                  }
                  ehooks_zero((tsdn_t *)local_90,
                              (ehooks_t *)((ulong)peVar6->e_addr & 0xfffffffffffff000),
                              (void *)((peVar6->field_2).e_size_esn & 0xfffffffffffff000),
                              (size_t)peVar9);
                  return peVar6;
                }
                ehooks_00 = local_90;
                if (peVar6 != (edata_t *)0x0) {
                  return peVar6;
                }
                goto LAB_00e694a5;
              }
              edata_cache = pac->edata_cache;
            }
            duckdb_je_edata_cache_put(tsdn,edata_cache,edata_00);
            break;
          }
          uVar7 = uVar7 + 1;
          iVar11 = iVar11 + 1;
        } while (uVar7 < 0xc6);
      }
      (pac->grow_mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&(pac->grow_mtx).field_0 + 0x48));
      ehooks_00 = local_90;
    }
    else {
      (pac->grow_mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&(pac->grow_mtx).field_0 + 0x48));
    }
LAB_00e694a5:
    if ((uVar3 != 0 & duckdb_je_opt_retain) == 0 && !guarded) {
      if (uVar3 == 0) {
        pvVar8 = (void *)0x0;
      }
      else {
        pvVar8 = (void *)((((anon_union_8_2_694bb3b2_for_edata_s_2 *)(uVar3 + 0x10))->e_size_esn &
                          0xfffffffffffff000) + ((ulong)*(void **)(uVar3 + 8) & 0xfffffffffffff000))
        ;
      }
      peVar6 = duckdb_je_extent_alloc_wrapper
                         (tsdn,local_88,ehooks_00,pvVar8,expand_edata_00,alignment,SUB81(local_70,0)
                          ,&commit,false);
    }
    else {
      peVar6 = (edata_t *)0x0;
    }
  }
  else {
    (pac->grow_mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&(pac->grow_mtx).field_0 + 0x48));
  }
  return peVar6;
}

Assistant:

edata_t *
ecache_alloc_grow(tsdn_t *tsdn, pac_t *pac, ehooks_t *ehooks, ecache_t *ecache,
    edata_t *expand_edata, size_t size, size_t alignment, bool zero,
    bool guarded) {
	assert(size != 0);
	assert(alignment != 0);
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	bool commit = true;
	edata_t *edata = extent_alloc_retained(tsdn, pac, ehooks, expand_edata,
	    size, alignment, zero, &commit, guarded);
	if (edata == NULL) {
		if (opt_retain && expand_edata != NULL) {
			/*
			 * When retain is enabled and trying to expand, we do
			 * not attempt extent_alloc_wrapper which does mmap that
			 * is very unlikely to succeed (unless it happens to be
			 * at the end).
			 */
			return NULL;
		}
		if (guarded) {
			/*
			 * Means no cached guarded extents available (and no
			 * grow_retained was attempted).  The pac_alloc flow
			 * will alloc regular extents to make new guarded ones.
			 */
			return NULL;
		}
		void *new_addr = (expand_edata == NULL) ? NULL :
		    edata_past_get(expand_edata);
		edata = extent_alloc_wrapper(tsdn, pac, ehooks, new_addr,
		    size, alignment, zero, &commit,
		    /* growing_retained */ false);
	}

	assert(edata == NULL || edata_pai_get(edata) == EXTENT_PAI_PAC);
	return edata;
}